

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crt_abstractions.c
# Opt level: O1

int mallocAndStrcpy_s(char **destination,char *source)

{
  bool bVar1;
  size_t sVar2;
  char *__dest;
  int iVar3;
  ulong uVar4;
  int iVar5;
  
  if (source == (char *)0x0 || destination == (char **)0x0) {
    return 0x16;
  }
  sVar2 = strlen(source);
  uVar4 = sVar2 + 1;
  sVar2 = 0xffffffffffffffff;
  if (uVar4 != 0) {
    sVar2 = uVar4;
  }
  if (sVar2 == 0xffffffffffffffff) {
    return 0xc;
  }
  __dest = (char *)malloc(sVar2);
  if (__dest == (char *)0x0) {
    return 0xc;
  }
  *destination = __dest;
  if (uVar4 != 0) {
    sVar2 = strlen(source);
    if (sVar2 + 1 <= uVar4) {
      memcpy(__dest,source,sVar2 + 1);
      iVar5 = 0;
      bVar1 = true;
      goto LAB_0010eec9;
    }
  }
  *__dest = '\0';
  iVar5 = 0x22;
  bVar1 = false;
LAB_0010eec9:
  iVar3 = 0;
  if (!bVar1) {
    free(__dest);
    *destination = (char *)0x0;
    iVar3 = iVar5;
  }
  return iVar3;
}

Assistant:

int mallocAndStrcpy_s(char** destination, const char* source)
{
    int result;
    int copied_result;
    /*Codes_SRS_CRT_ABSTRACTIONS_99_036: [destination parameter or source parameter is NULL, the error code returned shall be EINVAL and destination shall not be modified.]*/
    if ((destination == NULL) || (source == NULL))
    {
        /*If strDestination or strSource is a NULL pointer[...]these functions return EINVAL */
        result = EINVAL;
    }
    else
    {
        char* temp;
        size_t l = strlen(source);
        size_t malloc_size = safe_add_size_t(l, 1);

        /*Codes_SRS_CRT_ABSTRACTIONS_99_037: [Upon failure to allocate memory for the destination, the function will return ENOMEM.]*/
        if (malloc_size == SIZE_MAX ||
            (temp = (char*)malloc(malloc_size)) == NULL)
        {
            result = ENOMEM;
        }
        else
        {
            *destination = temp;
            /*Codes_SRS_CRT_ABSTRACTIONS_99_039: [mallocAndstrcpy_s shall copy the contents in the address source, including the terminating null character into location specified by the destination pointer after the memory allocation.]*/
            copied_result = strcpy_s(*destination, l + 1, source);
            if (copied_result != 0) /*strcpy_s error*/
            {
                free(*destination);
                *destination = NULL;
                result = copied_result;
            }
            else
            {
                /*Codes_SRS_CRT_ABSTRACTIONS_99_035: [mallocAndstrcpy_s shall return Zero upon success]*/
                result = 0;
            }
        }
    }
    return result;
}